

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfriendlist.cc
# Opt level: O1

bool __thiscall bdFriendList::removePeer(bdFriendList *this,bdNodeId *id)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdFriendEntry>_>,_std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
  pVar3;
  
  iVar2 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdFriendEntry>,_std::_Select1st<std::pair<const_bdNodeId,_bdFriendEntry>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
          ::find((_Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdFriendEntry>,_std::_Select1st<std::pair<const_bdNodeId,_bdFriendEntry>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
                  *)this,id);
  p_Var1 = &(this->mPeers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
    pVar3 = std::
            _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdFriendEntry>,_std::_Select1st<std::pair<const_bdNodeId,_bdFriendEntry>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
            ::equal_range((_Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdFriendEntry>,_std::_Select1st<std::pair<const_bdNodeId,_bdFriendEntry>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
                           *)this,id);
    std::
    _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdFriendEntry>,_std::_Select1st<std::pair<const_bdNodeId,_bdFriendEntry>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
    ::_M_erase_aux((_Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdFriendEntry>,_std::_Select1st<std::pair<const_bdNodeId,_bdFriendEntry>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
                    *)this,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
  }
  return (_Rb_tree_header *)iVar2._M_node != p_Var1;
}

Assistant:

bool bdFriendList::removePeer(const bdNodeId *id) {
	/* see if it exists... */
	std::map<bdNodeId, bdFriendEntry>::iterator it;
	it = mPeers.find(*id);
	if (it == mPeers.end()) {
#ifdef DEBUG_FRIENDLIST	
		std::cerr << "bdFriendList::removeFriend() Peer(";
		bdStdPrintNodeId(std::cerr, id);
		std::cerr << ") is unknown!";
		std::cerr << std::endl;
#endif

		return false;
	}

	mPeers.erase(*id);

	return true;
}